

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

string * getWord(string *__return_storage_ptr__,string *str,unsigned_long *pos)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  unsigned_long begin;
  unsigned_long count;
  unsigned_long *pos_local;
  string *str_local;
  
  begin = 0;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    bVar1 = isBlank(pcVar2);
    bVar3 = false;
    if (!bVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      bVar3 = *pcVar2 != ')';
    }
    if (!bVar3) break;
    begin = begin + 1;
  }
  *pos = begin + *pos;
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

std::string getWord(const std::string &str, unsigned long &pos) {
    unsigned long count = 0;
    auto begin = pos;
    while (!isBlank(str[pos + count]) && str[pos + count] != ')') {
        count++;
    }
    pos += count;
    return str.substr(begin, count);
}